

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O3

bool tinyusdz::anon_unknown_160::CompositeReferencesRec
               (uint32_t depth,AssetResolutionResolver *resolver,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *asset_search_paths,Layer *in_layer,PrimSpec *primspec,string *warn,string *err,
               ReferencesCompositionOptions *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Layer *pLVar2;
  undefined1 *puVar3;
  AssetPath *pAVar4;
  Path *pPVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  PrimSpec *extraout_RDX;
  PrimSpec *extraout_RDX_00;
  PrimSpec *extraout_RDX_01;
  PrimSpec *pPVar10;
  PrimSpec *extraout_RDX_02;
  long lVar11;
  string *psVar12;
  Path *pPVar13;
  char *pcVar14;
  PrimSpec *err_00;
  int iVar15;
  PrimSpec *child;
  Layer *pLVar16;
  ReferencesCompositionOptions *in_stack_ffffffffffffe770;
  string local_1880;
  PrimSpec *src_ps;
  Layer *local_1858;
  string local_1850;
  string *local_1830;
  string *local_1828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1820;
  undefined1 *local_1818;
  Layer *local_1810;
  string cwp;
  undefined1 local_17d8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  search_paths;
  ostringstream ss_e_1;
  _Rb_tree_node_base local_1790 [3];
  ios_base local_1730 [264];
  ostringstream ss_e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1618;
  undefined1 local_1608 [56];
  LayerMetas local_15d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
  local_a8;
  undefined8 local_78;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  void *pvStack_38;
  
  local_1810 = (Layer *)asset_search_paths;
  if (*(uint *)&(err->_M_dataplus)._M_p < depth) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,"CompositeReferencesRec",0x16);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
    poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0x272);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"Too deep.",9);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"\n",1);
    if (warn != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)warn,_ss_e_1);
      if ((_Rb_tree_node_base *)_ss_e_1 != local_1790) {
        operator_delete((void *)_ss_e_1,local_1790[0]._0_8_ + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    ::std::ios_base::~ios_base((ios_base *)&local_15d0.upAxis._metas.comment);
    return false;
  }
  pLVar16 = (Layer *)(in_layer->_prim_specs)._M_h._M_rehash_policy._M_next_resize;
  pLVar2 = (Layer *)(in_layer->_prim_specs)._M_h._M_single_bucket;
  err_00 = primspec;
  local_1858 = in_layer;
  if (pLVar16 != pLVar2) {
    do {
      err_00 = primspec;
      bVar6 = CompositeReferencesRec
                        (depth + 1,resolver,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_1810,pLVar16,primspec,warn,err,in_stack_ffffffffffffe770);
      if (!bVar6) {
        return false;
      }
      pLVar16 = (Layer *)((long)&(pLVar16->_metas).timeCodesPerSecond._metas.customData.contained +
                         0x18);
    } while (pLVar16 != pLVar2);
  }
  pLVar16 = local_1858;
  cwp._M_dataplus._M_p = (pointer)&cwp.field_2;
  lVar11 = *(long *)((long)&(local_1858->_metas).timeCodesPerSecond._metas.comment.contained + 0x18)
  ;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&cwp,lVar11,
             *(long *)((long)&(local_1858->_metas).timeCodesPerSecond._metas.comment.contained +
                      0x20) + lVar11);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&search_paths,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&(pLVar16->_metas).timeCodesPerSecond._metas.customData.contained);
  if (*(char *)((long)&(pLVar16->_metas).metersPerUnit._metas.comment.contained + 0x18) != '\x01')
  goto switchD_001a9bd1_default;
  switch(*(undefined4 *)((long)&(local_1858->_metas).metersPerUnit._metas.comment.contained + 0x20))
  {
  case 0:
  case 4:
    puVar3 = *(undefined1 **)
              ((long)&(local_1858->_metas).metersPerUnit._metas.comment.contained + 0x28);
    local_1818 = *(undefined1 **)&(local_1858->_metas).metersPerUnit._metas.customData;
    if (puVar3 != local_1818) {
      local_1820 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &err->_M_string_length;
      local_1828 = (string *)&(local_1858->_name)._M_string_length;
      pPVar13 = (Path *)(puVar3 + 0x40);
      do {
        paVar1 = &pPVar13[-1]._variant_part_str.field_2;
        _ss_e = (pointer)&local_1618;
        local_1618._M_local_buf[0] = '\0';
        pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_1608 + 0x30);
        local_1608._8_8_ = 1;
        local_1608._16_8_ = (_Hash_node_base *)0x0;
        local_1608._24_8_ = 0;
        local_1608._32_4_ = 1.0;
        local_1608._40_8_ = 0;
        local_1608._48_8_ = (__node_base_ptr)0x0;
        local_1608._0_8_ = pbVar9;
        LayerMetas::LayerMetas(&local_15d0);
        local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_a8._M_impl.super__Rb_tree_header._M_header;
        local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_78._0_1_ = true;
        local_78._1_1_ = true;
        local_78._2_1_ = true;
        local_78._3_1_ = true;
        local_78._4_1_ = true;
        local_78._5_1_ = true;
        local_78._6_1_ = true;
        local_78._7_1_ = true;
        local_70._M_p = (pointer)&local_60;
        local_68 = 0;
        local_60._M_local_buf[0] = '\0';
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pvStack_38 = (void *)0x0;
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        src_ps = (PrimSpec *)0x0;
        pAVar4 = *(AssetPath **)((long)&pPVar13[-1]._variant_part_str.field_2 + 8);
        local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
        if (pAVar4 == (AssetPath *)0x0) {
          if (((pPVar13->_prim_part)._M_string_length != 0) &&
             (*(pPVar13->_prim_part)._M_dataplus._M_p == '/')) {
            bVar6 = Layer::find_primspec_at(local_1810,pPVar13,&src_ps,warn);
            iVar15 = 1;
            pPVar10 = extraout_RDX_00;
            if (bVar6) goto LAB_001a9d71;
            goto LAB_001aa20f;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&ss_e_1,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&ss_e_1,"CompositeReferencesRec",0x16);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e_1,0x297);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          local_1850._M_dataplus._M_p = (pointer)&local_1850.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1850,
                     "Invalid asset path. assetPath is empty and primPath is not absolute path: {}",
                     "");
          Path::full_path_name_abi_cxx11_((string *)local_17d8,pPVar13);
          fmt::format<std::__cxx11::string>
                    (&local_1880,(fmt *)&local_1850,(string *)local_17d8,pbVar9);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&ss_e_1,local_1880._M_dataplus._M_p,
                              local_1880._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1880._M_dataplus._M_p != &local_1880.field_2) {
            operator_delete(local_1880._M_dataplus._M_p,local_1880.field_2._M_allocated_capacity + 1
                           );
          }
          if ((pointer)local_17d8._0_8_ != (pointer)(local_17d8 + 0x10)) {
            operator_delete((void *)local_17d8._0_8_,local_17d8._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1850._M_dataplus._M_p != &local_1850.field_2) goto LAB_001aa196;
LAB_001aa1a3:
          if (warn != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)warn,(ulong)local_1880._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1880._M_dataplus._M_p != &local_1880.field_2) {
              operator_delete(local_1880._M_dataplus._M_p,
                              local_1880.field_2._M_allocated_capacity + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e_1);
          ::std::ios_base::~ios_base(local_1730);
          iVar15 = 1;
        }
        else {
          err_00 = *(PrimSpec **)&pPVar13[-1]._variant_part_str.field_2;
          pbVar9 = local_1820;
          bVar6 = LoadAsset((anon_unknown_160 *)resolver,(AssetResolutionResolver *)&cwp,
                            (string *)&search_paths,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_1820,
                            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                             *)err_00,pAVar4,pPVar13,(Layer *)&ss_e,&src_ps,true,
                            *(bool *)((long)&(err->_M_dataplus)._M_p + 4),
                            *(bool *)((long)&(err->_M_dataplus)._M_p + 5),(string *)primspec,warn);
          pPVar10 = extraout_RDX;
          if (!bVar6) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&ss_e_1,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                       ,0x55);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&ss_e_1,"CompositeReferencesRec",0x16);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"():",3);
            poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e_1,0x2a5);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
            local_1850._M_dataplus._M_p = (pointer)&local_1850.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1850,"Failed to `references` asset `{}`","");
            fmt::format<std::__cxx11::string>
                      (&local_1880,(fmt *)&local_1850,(string *)paVar1,pbVar9);
LAB_001aa145:
            poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&ss_e_1,local_1880._M_dataplus._M_p,
                                local_1880._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1880._M_dataplus._M_p != &local_1880.field_2) {
              operator_delete(local_1880._M_dataplus._M_p,
                              local_1880.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1850._M_dataplus._M_p != &local_1850.field_2) {
LAB_001aa196:
              operator_delete(local_1850._M_dataplus._M_p,
                              local_1850.field_2._M_allocated_capacity + 1);
            }
            goto LAB_001aa1a3;
          }
LAB_001a9d71:
          pLVar16 = local_1858;
          if (src_ps == (PrimSpec *)0x0) {
            iVar15 = 7;
          }
          else {
            bVar6 = InheritPrimSpec((tinyusdz *)local_1858,src_ps,pPVar10,warn,(string *)err_00);
            if (!bVar6) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&ss_e_1,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                         ,0x55);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&ss_e_1,"CompositeReferencesRec",0x16);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"():",3);
              poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e_1,0x2b1);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
              local_1850._M_dataplus._M_p = (pointer)&local_1850.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1850,"Failed to reference layer `{}`","");
              fmt::format<tinyusdz::value::AssetPath>
                        ((string *)&local_1880,&local_1850,(AssetPath *)paVar1);
              goto LAB_001aa145;
            }
            if ((pLVar16->_name).field_2._M_allocated_capacity != 0) {
              iVar7 = ::std::__cxx11::string::compare((char *)local_1828);
              iVar15 = 0;
              if (iVar7 != 0) goto LAB_001aa20f;
            }
            iVar15 = 0;
            if (((src_ps->_typeName)._M_string_length != 0) &&
               (iVar7 = ::std::__cxx11::string::compare((char *)&src_ps->_typeName), iVar15 = 0,
               iVar7 != 0)) {
              ::std::__cxx11::string::_M_assign(local_1828);
            }
          }
        }
LAB_001aa20f:
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_p != &local_60) {
          operator_delete(local_70._M_p,
                          CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) +
                          1);
        }
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
        ::_M_erase(&local_a8,(_Link_type)local_a8._M_impl.super__Rb_tree_header._M_header._M_parent)
        ;
        LayerMetas::~LayerMetas(&local_15d0);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_1608);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_ss_e != &local_1618) {
          operator_delete(_ss_e,CONCAT71(local_1618._M_allocated_capacity._1_7_,
                                         local_1618._M_local_buf[0]) + 1);
        }
        if ((iVar15 != 7) && (iVar15 != 0)) goto LAB_001aacd0;
        pPVar5 = pPVar13 + 1;
        pPVar13 = (Path *)&pPVar13[1]._variant_part_str;
      } while (&pPVar5->_variant_part != (string *)local_1818);
    }
  default:
switchD_001a9bd1_default:
    pLVar16 = local_1858;
    if (*(char *)((long)&(local_1858->_metas).metersPerUnit._metas.comment.contained + 0x18) ==
        '\x01') {
      ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::~vector
                ((vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *)
                 ((long)&(local_1858->_metas).metersPerUnit._metas.comment.contained + 0x28));
    }
    *(undefined1 *)((long)&(pLVar16->_metas).metersPerUnit._metas.comment.contained + 0x18) = 0;
    bVar6 = true;
    goto LAB_001aacf8;
  case 1:
    puVar3 = *(undefined1 **)
              ((long)&(local_1858->_metas).metersPerUnit._metas.comment.contained + 0x28);
    local_1818 = *(undefined1 **)&(local_1858->_metas).metersPerUnit._metas.customData;
    if (puVar3 != local_1818) {
      local_1820 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &err->_M_string_length;
      local_1828 = (string *)&(local_1858->_name)._M_string_length;
      pPVar13 = (Path *)(puVar3 + 0x40);
      local_1830 = warn;
      do {
        paVar1 = &pPVar13[-1]._variant_part_str.field_2;
        _ss_e = (pointer)&local_1618;
        local_1618._M_local_buf[0] = '\0';
        pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_1608 + 0x30);
        local_1608._8_8_ = 1;
        local_1608._16_8_ = (_Hash_node_base *)0x0;
        local_1608._24_8_ = 0;
        local_1608._32_4_ = 1.0;
        local_1608._40_8_ = 0;
        local_1608._48_8_ = (__node_base_ptr)0x0;
        local_1608._0_8_ = pbVar9;
        LayerMetas::LayerMetas(&local_15d0);
        local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_a8._M_impl.super__Rb_tree_header._M_header;
        local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_78._0_1_ = true;
        local_78._1_1_ = true;
        local_78._2_1_ = true;
        local_78._3_1_ = true;
        local_78._4_1_ = true;
        local_78._5_1_ = true;
        local_78._6_1_ = true;
        local_78._7_1_ = true;
        local_70._M_p = (pointer)&local_60;
        local_68 = 0;
        local_60._M_local_buf[0] = '\0';
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pvStack_38 = (void *)0x0;
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        src_ps = (PrimSpec *)0x0;
        pAVar4 = *(AssetPath **)((long)&pPVar13[-1]._variant_part_str.field_2 + 8);
        local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
        if (pAVar4 == (AssetPath *)0x0) {
          if (((pPVar13->_prim_part)._M_string_length != 0) &&
             (*(pPVar13->_prim_part)._M_dataplus._M_p == '/')) {
            bVar6 = Layer::find_primspec_at(local_1810,pPVar13,&src_ps,local_1830);
            iVar15 = 1;
            pPVar10 = extraout_RDX_02;
            if (bVar6) goto LAB_001aa4fc;
            goto LAB_001aa9a0;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&ss_e_1,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&ss_e_1,"CompositeReferencesRec",0x16);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e_1,0x2d9);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          local_1850._M_dataplus._M_p = (pointer)&local_1850.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1850,
                     "Invalid asset path. assetPath is empty and primPath is not absolute path: {}",
                     "");
          Path::full_path_name_abi_cxx11_((string *)local_17d8,pPVar13);
          fmt::format<std::__cxx11::string>
                    (&local_1880,(fmt *)&local_1850,(string *)local_17d8,pbVar9);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&ss_e_1,local_1880._M_dataplus._M_p,
                              local_1880._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1880._M_dataplus._M_p != &local_1880.field_2) {
            operator_delete(local_1880._M_dataplus._M_p,local_1880.field_2._M_allocated_capacity + 1
                           );
          }
          psVar12 = local_1830;
          if ((pointer)local_17d8._0_8_ != (pointer)(local_17d8 + 0x10)) {
            operator_delete((void *)local_17d8._0_8_,local_17d8._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1850._M_dataplus._M_p != &local_1850.field_2) goto LAB_001aa927;
LAB_001aa934:
          if (psVar12 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)psVar12,(ulong)local_1880._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1880._M_dataplus._M_p != &local_1880.field_2) {
              operator_delete(local_1880._M_dataplus._M_p,
                              local_1880.field_2._M_allocated_capacity + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e_1);
          ::std::ios_base::~ios_base(local_1730);
          iVar15 = 1;
        }
        else {
          err_00 = *(PrimSpec **)&pPVar13[-1]._variant_part_str.field_2;
          pbVar9 = local_1820;
          bVar6 = LoadAsset((anon_unknown_160 *)resolver,(AssetResolutionResolver *)&cwp,
                            (string *)&search_paths,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_1820,
                            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                             *)err_00,pAVar4,pPVar13,(Layer *)&ss_e,&src_ps,true,
                            *(bool *)((long)&(err->_M_dataplus)._M_p + 4),
                            *(bool *)((long)&(err->_M_dataplus)._M_p + 5),(string *)primspec,
                            local_1830);
          pPVar10 = extraout_RDX_01;
          if (!bVar6) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&ss_e_1,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                       ,0x55);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&ss_e_1,"CompositeReferencesRec",0x16);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"():",3);
            poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e_1,0x2e3);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
            local_1850._M_dataplus._M_p = (pointer)&local_1850.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1850,"Failed to `references` asset `{}`","");
            fmt::format<std::__cxx11::string>
                      (&local_1880,(fmt *)&local_1850,(string *)paVar1,pbVar9);
LAB_001aa8d1:
            poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&ss_e_1,local_1880._M_dataplus._M_p,
                                local_1880._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1880._M_dataplus._M_p != &local_1880.field_2) {
              operator_delete(local_1880._M_dataplus._M_p,
                              local_1880.field_2._M_allocated_capacity + 1);
            }
            psVar12 = local_1830;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1850._M_dataplus._M_p != &local_1850.field_2) {
LAB_001aa927:
              operator_delete(local_1850._M_dataplus._M_p,
                              local_1850.field_2._M_allocated_capacity + 1);
            }
            goto LAB_001aa934;
          }
LAB_001aa4fc:
          pLVar16 = local_1858;
          if (src_ps == (PrimSpec *)0x0) {
            iVar15 = 0x17;
          }
          else {
            bVar6 = OverridePrimSpec((tinyusdz *)local_1858,src_ps,pPVar10,local_1830,
                                     (string *)err_00);
            if (!bVar6) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&ss_e_1,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                         ,0x55);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&ss_e_1,"CompositeReferencesRec",0x16);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"():",3);
              poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e_1,0x2ef);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
              local_1850._M_dataplus._M_p = (pointer)&local_1850.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1850,"Failed to reference layer `{}`","");
              fmt::format<tinyusdz::value::AssetPath>
                        ((string *)&local_1880,&local_1850,(AssetPath *)paVar1);
              goto LAB_001aa8d1;
            }
            if ((pLVar16->_name).field_2._M_allocated_capacity != 0) {
              iVar7 = ::std::__cxx11::string::compare((char *)local_1828);
              iVar15 = 0;
              if (iVar7 != 0) goto LAB_001aa9a0;
            }
            iVar15 = 0;
            if (((src_ps->_typeName)._M_string_length != 0) &&
               (iVar7 = ::std::__cxx11::string::compare((char *)&src_ps->_typeName), iVar15 = 0,
               iVar7 != 0)) {
              ::std::__cxx11::string::_M_assign(local_1828);
            }
          }
        }
LAB_001aa9a0:
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_p != &local_60) {
          operator_delete(local_70._M_p,
                          CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) +
                          1);
        }
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
        ::_M_erase(&local_a8,(_Link_type)local_a8._M_impl.super__Rb_tree_header._M_header._M_parent)
        ;
        LayerMetas::~LayerMetas(&local_15d0);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_1608);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_ss_e != &local_1618) {
          operator_delete(_ss_e,CONCAT71(local_1618._M_allocated_capacity._1_7_,
                                         local_1618._M_local_buf[0]) + 1);
        }
        if ((iVar15 != 0x17) && (iVar15 != 0)) goto LAB_001aacd0;
        pPVar5 = pPVar13 + 1;
        pPVar13 = (Path *)&pPVar13[1]._variant_part_str;
      } while (&pPVar5->_variant_part != (string *)local_1818);
    }
    goto switchD_001a9bd1_default;
  case 2:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,"CompositeReferencesRec",0x16);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
    poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0x2c3);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    pcVar14 = "`add` references are not supported yet.";
    lVar11 = 0x27;
    break;
  case 3:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,"CompositeReferencesRec",0x16);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
    poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0x2c1);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    pcVar14 = "`delete` references are not supported yet.";
    lVar11 = 0x2a;
    break;
  case 5:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,"CompositeReferencesRec",0x16);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
    poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0x2c5);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    pcVar14 = "`order` references are not supported yet.";
    lVar11 = 0x29;
    break;
  case 6:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,"CompositeReferencesRec",0x16);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
    poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0x2c7);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    pcVar14 = "Invalid listedit qualifier to for `references`.";
    lVar11 = 0x2f;
  }
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,pcVar14,lVar11);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"\n",1);
  if (warn != (string *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)warn,_ss_e_1);
    if ((_Rb_tree_node_base *)_ss_e_1 != local_1790) {
      operator_delete((void *)_ss_e_1,local_1790[0]._0_8_ + 1);
    }
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
  ::std::ios_base::~ios_base((ios_base *)&local_15d0.upAxis._metas.comment);
LAB_001aaccc:
  bVar6 = false;
LAB_001aacf8:
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&search_paths);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cwp._M_dataplus._M_p != &cwp.field_2) {
    operator_delete(cwp._M_dataplus._M_p,cwp.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
LAB_001aacd0:
  if (iVar15 == 0) goto switchD_001a9bd1_default;
  goto LAB_001aaccc;
}

Assistant:

bool CompositeReferencesRec(uint32_t depth, AssetResolutionResolver &resolver,
                            const std::vector<std::string> &asset_search_paths,
                            const Layer &in_layer,
                            PrimSpec &primspec /* [inout] */, std::string *warn,
                            std::string *err,
                            const ReferencesCompositionOptions &options) {
  if (depth > options.max_depth) {
    PUSH_ERROR_AND_RETURN("Too deep.");
  }

  // Traverse children first.
  for (auto &child : primspec.children()) {
    if (!CompositeReferencesRec(depth + 1, resolver, asset_search_paths, in_layer, child,
                                warn, err, options)) {
      return false;
    }
  }

  // Use PrimSpec's AssetResolution state.
  std::string cwp = primspec.get_current_working_path();
  std::vector<std::string> search_paths = primspec.get_asset_search_paths();

  if (primspec.metas().references) {
    const ListEditQual &qual = primspec.metas().references.value().first;
    const auto &refecences = primspec.metas().references.value().second;

    if ((qual == ListEditQual::ResetToExplicit) ||
        (qual == ListEditQual::Prepend)) {
      for (const auto &reference : refecences) {
        Layer layer;
        const PrimSpec *src_ps{nullptr};

        if (reference.asset_path.GetAssetPath().empty()) {
          if (reference.prim_path.is_absolute_path()) {
            // Inherit-like operation.

            if (!in_layer.find_primspec_at(reference.prim_path, &src_ps, err)) {
              return false;
            }

          } else {
            PUSH_ERROR_AND_RETURN(
                fmt::format("Invalid asset path. assetPath is empty and "
                            "primPath is not absolute path: {}",
                            reference.prim_path.full_path_name()));
          }
        } else {

          DCOUT("reference.prim_path = " << reference.prim_path);
          DCOUT("primspec.cwp = " << cwp);
          DCOUT("primspec.search_paths = " << search_paths);
          if (!LoadAsset(resolver, cwp, search_paths, options.fileformats,
                         reference.asset_path, reference.prim_path, &layer,
                         &src_ps, /* error_when_no_prims_found */ true,
                         options.error_when_asset_not_found,
                         options.error_when_unsupported_fileformat, warn, err)) {
            PUSH_ERROR_AND_RETURN(
                fmt::format("Failed to `references` asset `{}`",
                            reference.asset_path.GetAssetPath()));
          }
        }

        if (!src_ps) {
          // LoadAsset allowed not-found or unsupported file. so do nothing.
          continue;
        }

        // `inherits` op
        if (!InheritPrimSpec(primspec, *src_ps, warn, err)) {
          PUSH_ERROR_AND_RETURN(fmt::format("Failed to reference layer `{}`",
                                            reference.asset_path));
        }

        // Modify Prim type if this PrimSpec is Model type.
        if (primspec.typeName().empty() || primspec.typeName() == "Model") {
          if (src_ps->typeName().empty() || src_ps->typeName() == "Model") {
            // pass
          } else {
            primspec.typeName() = src_ps->typeName();
          }
        }

        DCOUT("inherit done: primspec = " << primspec.name());
      }

    } else if (qual == ListEditQual::Delete) {
      PUSH_ERROR_AND_RETURN("`delete` references are not supported yet.");
    } else if (qual == ListEditQual::Add) {
      PUSH_ERROR_AND_RETURN("`add` references are not supported yet.");
    } else if (qual == ListEditQual::Order) {
      PUSH_ERROR_AND_RETURN("`order` references are not supported yet.");
    } else if (qual == ListEditQual::Invalid) {
      PUSH_ERROR_AND_RETURN("Invalid listedit qualifier to for `references`.");
    } else if (qual == ListEditQual::Append) {
      for (const auto &reference : refecences) {
        Layer layer;
        const PrimSpec *src_ps{nullptr};

        if (reference.asset_path.GetAssetPath().empty()) {
          if (reference.prim_path.is_absolute_path()) {
            // Inherit-like operation.

            if (!in_layer.find_primspec_at(reference.prim_path, &src_ps, err)) {
              return false;
            }

          } else {
            PUSH_ERROR_AND_RETURN(
                fmt::format("Invalid asset path. assetPath is empty and "
                            "primPath is not absolute path: {}",
                            reference.prim_path.full_path_name()));
          }
        } else {
          if (!LoadAsset(resolver, cwp, search_paths, options.fileformats,
                         reference.asset_path, reference.prim_path, &layer,
                         &src_ps, /* error_when_no_prims */ true,
                         options.error_when_asset_not_found,
                         options.error_when_unsupported_fileformat, warn, err)) {
            PUSH_ERROR_AND_RETURN(
                fmt::format("Failed to `references` asset `{}`",
                            reference.asset_path.GetAssetPath()));
          }
        }

        if (!src_ps) {
          // LoadAsset allowed not-found or unsupported file. so do nothing.
          continue;
        }

        // `over` op
        if (!OverridePrimSpec(primspec, *src_ps, warn, err)) {
          PUSH_ERROR_AND_RETURN(fmt::format("Failed to reference layer `{}`",
                                            reference.asset_path));
        }

        // Modify Prim type if this PrimSpec is Model type.
        if (primspec.typeName().empty() || primspec.typeName() == "Model") {
          if (src_ps->typeName().empty() || src_ps->typeName() == "Model") {
            // pass
          } else {
            primspec.typeName() = src_ps->typeName();
          }
        }
      }
    }

  }

  // Remove `references`.
  primspec.metas().references.reset();

  return true;
}